

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O0

void write_syms(void)

{
  symbol_entry_t sym;
  block_header_t header;
  char acStack_34 [32];
  int local_14;
  int local_10;
  sym_type_t local_c;
  undefined4 local_8;
  int local_4;
  
  if (num_syms != 0) {
    local_8 = 1;
    local_4 = num_syms;
    write_block_header((block_header_t *)0x1091fe);
    for (cur = root; cur != (sym_t *)0x0; cur = cur->next) {
      strncpy(acStack_34,cur->id,0x20);
      local_14 = cur->section_id;
      local_10 = cur->offset;
      local_c = cur->type;
      write_symbol_entry((symbol_entry_t *)0x109270);
    }
  }
  return;
}

Assistant:

void write_syms()
{
    block_header_t header;
    symbol_entry_t sym;
    if (num_syms == 0)
        return;

    header.type = symbols;
    header.num_entries = num_syms;
    write_block_header(&header);
    cur = root;
    while (cur)
    {
        sym.sym_id = cur->sym_id;
        strncpy((char*)sym.id, cur->id, MAX_ID_LEN + 1);
        sym.section_id = cur->section_id;
        sym.offset = cur->offset;
        sym.type = cur->type;
        write_symbol_entry(&sym);
        cur = cur->next;
    }
}